

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.h
# Opt level: O0

void __thiscall gmlc::networking::TcpAcceptor::~TcpAcceptor(TcpAcceptor *this)

{
  int in_ESI;
  TcpAcceptor *in_RDI;
  
  close(in_RDI,in_ESI);
  concurrency::TriggerVariable::~TriggerVariable((TriggerVariable *)in_RDI);
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x7e86ff);
  std::function<bool_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_const_std::error_code_&)>::
  ~function((function<bool_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_const_std::error_code_&)>
             *)0x7e8710);
  std::
  function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
  ::~function((function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
               *)0x7e8721);
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::~basic_socket_acceptor
            ((basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *)in_RDI);
  std::enable_shared_from_this<gmlc::networking::TcpAcceptor>::~enable_shared_from_this
            ((enable_shared_from_this<gmlc::networking::TcpAcceptor> *)0x7e8739);
  return;
}

Assistant:

~TcpAcceptor()
    {
        try {
            close();
        }
        catch (...) {
        }
    }